

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O3

void anon_unknown.dwarf_5450::indirect(ostream *stream,Indirect *type)

{
  ostream *poVar1;
  anon_unknown_dwarf_5450 *local_98;
  string *local_90;
  anon_unknown_dwarf_5450 local_88 [16];
  string local_78;
  string local_58;
  anon_unknown_dwarf_5450 *local_38;
  string *local_30;
  anon_unknown_dwarf_5450 local_28 [16];
  
  std::__ostream_insert<char,std::char_traits<char>>(stream," name=\"",7);
  Typelib::Type::getName_abi_cxx11_();
  xmlEscape(&local_58,local_38,local_30);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,local_58._M_dataplus._M_p,local_58._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\" of=\"",6);
  Typelib::Indirect::getIndirection();
  Typelib::Type::getName_abi_cxx11_();
  xmlEscape(&local_78,local_98,local_90);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_78._M_dataplus._M_p,local_78._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if (local_98 != local_88) {
    operator_delete(local_98);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  return;
}

Assistant:

void indirect(ostream& stream, Indirect const& type)
    {
        stream
            << " name=\"" << xmlEscape(type.getName())
            << "\" of=\"" << xmlEscape(type.getIndirection().getName()) << "\"";
    }